

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

QWidget * __thiscall QLayout::parentWidget(QLayout *this)

{
  QWidget *pQVar1;
  
  while( true ) {
    pQVar1 = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
    if ((*(byte *)(*(long *)&this->field_0x8 + 0x8c) & 1) != 0) {
      return pQVar1;
    }
    if (pQVar1 == (QWidget *)0x0) break;
    this = (QLayout *)QMetaObject::cast((QObject *)&staticMetaObject);
    if (this == (QLayout *)0x0) {
      parentWidget();
      return (QWidget *)0x0;
    }
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget *QLayout::parentWidget() const
{
    Q_D(const QLayout);
    if (!d->topLevel) {
        if (parent()) {
            QLayout *parentLayout = qobject_cast<QLayout*>(parent());
            if (Q_UNLIKELY(!parentLayout)) {
                qWarning("QLayout::parentWidget: A layout can only have another layout as a parent.");
                return nullptr;
            }
            return parentLayout->parentWidget();
        } else {
            return nullptr;
        }
    } else {
        Q_ASSERT(parent() && parent()->isWidgetType());
        return static_cast<QWidget *>(parent());
    }
}